

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseStats::TestCaseStats(TestCaseStats *this,TestCaseStats *param_2)

{
  TestCaseInfo *in_RSI;
  undefined8 *in_RDI;
  Totals *in_stack_ffffffffffffffb8;
  Totals *in_stack_ffffffffffffffc0;
  TestCaseInfo *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__TestCaseStats_00a1ba40;
  TestCaseInfo::TestCaseInfo(in_RSI,in_stack_ffffffffffffffe8);
  Totals::Totals(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::string((string *)(in_RDI + 0x24),(string *)&in_RSI[1].lcaseTags);
  std::__cxx11::string::string((string *)(in_RDI + 0x28),(string *)&in_RSI[1].lineInfo.line);
  *(byte *)(in_RDI + 0x2c) = in_RSI[2].name.field_2._M_local_buf[0] & 1;
  return;
}

Assistant:

TestCaseStats( TestCaseStats const& )              = default;